

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_formatimpl.cpp
# Opt level: O0

int32_t icu_63::number::impl::NumberFormatterImpl::writeIntegerDigits
                  (MicroProps *micros,DecimalQuantity *quantity,NumberStringBuilder *string,
                  int32_t index,UErrorCode *status)

{
  NumberStringBuilder *this;
  bool bVar1;
  int8_t digit;
  int32_t iVar2;
  int8_t nextDigit;
  UnicodeString local_80;
  int32_t local_3c;
  int local_38;
  int i;
  int integerCount;
  int length;
  UErrorCode *status_local;
  NumberStringBuilder *pNStack_20;
  int32_t index_local;
  NumberStringBuilder *string_local;
  DecimalQuantity *quantity_local;
  MicroProps *micros_local;
  
  i = 0;
  _integerCount = status;
  status_local._4_4_ = index;
  pNStack_20 = string;
  string_local = (NumberStringBuilder *)quantity;
  quantity_local = (DecimalQuantity *)micros;
  iVar2 = DecimalQuantity::getUpperDisplayMagnitude(quantity);
  local_38 = iVar2 + 1;
  for (local_3c = 0; local_3c < local_38; local_3c = local_3c + 1) {
    bVar1 = Grouper::groupAtPosition
                      ((Grouper *)&quantity_local->rOptPos,local_3c,(DecimalQuantity *)string_local)
    ;
    this = pNStack_20;
    iVar2 = status_local._4_4_;
    if (bVar1) {
      if ((quantity_local[1].scale & 1) == 0) {
        DecimalFormatSymbols::getSymbol
                  (&local_80,*(DecimalFormatSymbols **)&quantity_local[1].precision,
                   kGroupingSeparatorSymbol);
      }
      else {
        DecimalFormatSymbols::getSymbol
                  (&local_80,*(DecimalFormatSymbols **)&quantity_local[1].precision,
                   kMonetaryGroupingSeparatorSymbol);
      }
      iVar2 = NumberStringBuilder::insert
                        (this,iVar2,&local_80,UNUM_GROUPING_SEPARATOR_FIELD,_integerCount);
      i = iVar2 + i;
      UnicodeString::~UnicodeString(&local_80);
    }
    digit = DecimalQuantity::getDigit((DecimalQuantity *)string_local,local_3c);
    iVar2 = utils::insertDigitFromSymbols
                      (pNStack_20,status_local._4_4_,digit,
                       *(DecimalFormatSymbols **)&quantity_local[1].precision,UNUM_INTEGER_FIELD,
                       _integerCount);
    i = iVar2 + i;
  }
  return i;
}

Assistant:

int32_t NumberFormatterImpl::writeIntegerDigits(const MicroProps& micros, DecimalQuantity& quantity,
                                                NumberStringBuilder& string, int32_t index,
                                                UErrorCode& status) {
    int length = 0;
    int integerCount = quantity.getUpperDisplayMagnitude() + 1;
    for (int i = 0; i < integerCount; i++) {
        // Add grouping separator
        if (micros.grouping.groupAtPosition(i, quantity)) {
            length += string.insert(
                    index,
                    micros.useCurrency ? micros.symbols->getSymbol(
                            DecimalFormatSymbols::ENumberFormatSymbol::kMonetaryGroupingSeparatorSymbol)
                                       : micros.symbols->getSymbol(
                            DecimalFormatSymbols::ENumberFormatSymbol::kGroupingSeparatorSymbol),
                    UNUM_GROUPING_SEPARATOR_FIELD,
                    status);
        }

        // Get and append the next digit value
        int8_t nextDigit = quantity.getDigit(i);
        length += utils::insertDigitFromSymbols(
                string, index, nextDigit, *micros.symbols, UNUM_INTEGER_FIELD, status);
    }
    return length;
}